

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O2

void __thiscall cppurses::detail::Textbox_base::scroll_up(Textbox_base *this,size_t n)

{
  size_t sVar1;
  ulong uVar2;
  Point position;
  
  if ((this->super_Text_display).top_line_ != 0) {
    Text_display::scroll_up(&this->super_Text_display,n);
    uVar2 = n + (this->super_Text_display).super_Widget.cursor.position_.y;
    sVar1 = Widget::height((Widget *)this);
    if (sVar1 - 1 < uVar2) {
      sVar1 = Widget::height((Widget *)this);
      uVar2 = sVar1 - 1;
    }
    position.y = uVar2;
    position.x = (this->super_Text_display).super_Widget.cursor.position_.x;
    set_cursor(this,position);
    return;
  }
  return;
}

Assistant:

void Textbox_base::scroll_up(std::size_t n) {
    if (this->top_line() == 0) {
        return;
    }
    Text_display::scroll_up(n);
    auto y = this->cursor.y() + n;
    if (y > this->height() - 1) {
        y = this->height() - 1;
    }
    this->set_cursor({this->cursor.x(), y});
}